

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,size_type expected_max_items_in_table,TransparentHasher *hf,
                  TransparentHasher *eql,SelectKey *ext,SetKey *set,
                  Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *this_00;
  TransparentHasher *in_RCX;
  long in_RSI;
  size_type in_RDI;
  SelectKey *in_R8;
  SetKey *in_R9;
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *unaff_retaddr;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *in_stack_00000008;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000010;
  hasher *in_stack_ffffffffffffff78;
  Settings *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  
  Settings::Settings(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo((KeyInfo *)(in_RDI + 0x30),in_R8,in_R9,in_RCX);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  if (in_RSI != 0) {
    sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
    min_buckets(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>::Alloc<int>
            ((Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffc0,in_stack_00000008);
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
  ::sparsetable(in_stack_00000010,(size_type)in_stack_00000008,unaff_retaddr);
  Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffc0);
  this_00 = (sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)
            bucket_count((sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0xa1faf8);
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  reset_thresholds(this_00,in_RDI);
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }